

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

Value * __thiscall
cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  __node_base_ptr *pp_Var1;
  bool bVar2;
  Value *pVVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  Value local_280;
  Value local_258;
  reference local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>
  *i;
  iterator __end1_1;
  iterator __begin1_1;
  JsonValueMapType *__range1_1;
  Value generators;
  Value *gen_1;
  Value local_190;
  Value local_168;
  Value local_140;
  Value local_118;
  undefined1 local_f0 [8];
  Value gen;
  GeneratorInfo *gi;
  iterator __end1;
  iterator __begin1;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *__range1;
  JsonValueMapType generatorMap;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  Value local_48;
  byte local_1a;
  byte local_19;
  cmake *pcStack_18;
  bool haveServerMode_local;
  cmake *this_local;
  Value *obj;
  
  local_1a = 0;
  local_19 = haveServerMode;
  pcStack_18 = this;
  this_local = (cmake *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  ReportVersionJson(&local_48,this);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar3,&local_48);
  Json::Value::~Value(&local_48);
  pp_Var1 = &generatorMap._M_h._M_single_bucket;
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::vector
            ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)pp_Var1);
  GetRegisteredGenerators
            (this,(vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)pp_Var1,
             true);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                   *)&__range1);
  pp_Var1 = &generatorMap._M_h._M_single_bucket;
  __end1 = std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::begin
                     ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)pp_Var1
                     );
  gi = (GeneratorInfo *)
       std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::end
                 ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)pp_Var1);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                                     *)&gi), bVar2) {
    gen.limit_ = (ptrdiff_t)
                 __gnu_cxx::
                 __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
                 ::operator*(&__end1);
    if ((((reference)gen.limit_)->isAlias & 1U) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                               *)&__range1,(key_type *)(gen.limit_ + 0x20));
        pVVar3 = Json::Value::operator[](pmVar5,"extraGenerators");
        Json::Value::Value((Value *)&generators.limit_,(string *)(gen.limit_ + 0x40));
        Json::Value::append(pVVar3,(Value *)&generators.limit_);
        Json::Value::~Value((Value *)&generators.limit_);
      }
      else {
        Json::Value::Value((Value *)local_f0,objectValue);
        Json::Value::Value(&local_118,(string *)gen.limit_);
        pVVar3 = Json::Value::operator[]((Value *)local_f0,"name");
        Json::Value::operator=(pVVar3,&local_118);
        Json::Value::~Value(&local_118);
        Json::Value::Value(&local_140,(bool)(*(byte *)(gen.limit_ + 0x60) & 1));
        pVVar3 = Json::Value::operator[]((Value *)local_f0,"toolsetSupport");
        Json::Value::operator=(pVVar3,&local_140);
        Json::Value::~Value(&local_140);
        Json::Value::Value(&local_168,(bool)(*(byte *)(gen.limit_ + 0x61) & 1));
        pVVar3 = Json::Value::operator[]((Value *)local_f0,"platformSupport");
        Json::Value::operator=(pVVar3,&local_168);
        Json::Value::~Value(&local_168);
        Json::Value::Value(&local_190,arrayValue);
        pVVar3 = Json::Value::operator[]((Value *)local_f0,"extraGenerators");
        Json::Value::operator=(pVVar3,&local_190);
        Json::Value::~Value(&local_190);
        Json::Value::Value((Value *)&gen_1,(Value *)local_f0);
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                               *)&__range1,(key_type *)gen.limit_);
        Json::Value::operator=(pmVar5,(Value *)&gen_1);
        Json::Value::~Value((Value *)&gen_1);
        Json::Value::~Value((Value *)local_f0);
      }
    }
    __gnu_cxx::
    __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value((Value *)&__range1_1,arrayValue);
  __end1_1 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                      *)&__range1);
  i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>
       *)std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                *)&__range1);
  while (bVar2 = std::__detail::operator!=
                           (&__end1_1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_true>
                              *)&i), bVar2) {
    local_230 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
                ::operator*(&__end1_1);
    Json::Value::append((Value *)&__range1_1,&local_230->second);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_false,_true>
    ::operator++(&__end1_1);
  }
  Json::Value::Value(&local_258,(Value *)&__range1_1);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar3,&local_258);
  Json::Value::~Value(&local_258);
  Json::Value::Value(&local_280,(bool)(local_19 & 1));
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar3,&local_280);
  Json::Value::~Value(&local_280);
  local_1a = 1;
  Json::Value::~Value((Value *)&__range1_1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>_>
                    *)&__range1);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
            ((vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *)
             &generatorMap._M_h._M_single_bucket);
  if ((local_1a & 1) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson(bool haveServerMode) const
{
  Json::Value obj = Json::objectValue;

  // Version information:
  obj["version"] = this->ReportVersionJson();

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  JsonValueMapType generatorMap;
  for (cmake::GeneratorInfo const& gi : generatorInfoList) {
    if (gi.isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (gi.extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = gi.name;
      gen["toolsetSupport"] = gi.supportsToolset;
      gen["platformSupport"] = gi.supportsPlatform;
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[gi.name] = gen;
    } else {
      Json::Value& gen = generatorMap[gi.baseName];
      gen["extraGenerators"].append(gi.extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (auto const& i : generatorMap) {
    generators.append(i.second);
  }
  obj["generators"] = generators;
  obj["serverMode"] = haveServerMode;

  return obj;
}